

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_Vx_annotation.cpp
# Opt level: O3

ON_Text * ON_Text::CreateFromV5TextObject
                    (ON_OBSOLETE_V5_TextObject *V5_text_object,
                    ON_3dmAnnotationContext *annotation_context,ON_Text *destination)

{
  bool bVar1;
  TextHorizontalAlignment TVar2;
  TextVerticalAlignment TVar3;
  bool bDraw;
  MaskType MVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ON_Color color;
  ON_DimStyle *pOVar8;
  ON_Plane *pOVar9;
  wchar_t *pwVar10;
  ON_TextMask *pOVar11;
  ON_3dmAnnotationSettings *pOVar12;
  long lVar13;
  ON_Plane *pOVar14;
  ON_Plane *pOVar15;
  TextVerticalAlignment value;
  TextHorizontalAlignment value_00;
  byte bVar16;
  double dVar17;
  double dVar18;
  ON_wString newtxt;
  ON_wString txt;
  double wrapwidth;
  ON_TextMask mask;
  ON_Plane plane;
  ON_wString local_218;
  ON_wString local_210;
  double local_208;
  double local_200;
  ON_TextMask local_1f8;
  double local_1c8;
  double local_1c0;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_1b8;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_1b4;
  ON_Plane local_1b0;
  ON_Plane local_130;
  ON_Plane local_b0;
  
  bVar16 = 0;
  if (annotation_context == (ON_3dmAnnotationContext *)0x0) {
    annotation_context = &ON_3dmAnnotationContext::Default;
  }
  pOVar8 = ON_3dmAnnotationContext::DimStyle(annotation_context);
  uVar5 = (*(V5_text_object->super_ON_OBSOLETE_V5_Annotation).super_ON_Geometry.super_ON_Object.
            _vptr_ON_Object[0x26])(V5_text_object);
  value_00 = Center;
  if ((uVar5 & 7) != 2) {
    value_00 = ((uVar5 & 7) == 4) * '\x02';
  }
  value = Bottom;
  if ((uVar5 & 0x70000) != 0x10000) {
    value = ((uVar5 & 0x70000) == 0x20000) * '\x03';
  }
  pOVar9 = ON_OBSOLETE_V5_Annotation::Plane(&V5_text_object->super_ON_OBSOLETE_V5_Annotation);
  pOVar14 = &local_1b0;
  for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pOVar14->origin).x = (pOVar9->origin).x;
    pOVar9 = (ON_Plane *)((long)pOVar9 + (ulong)bVar16 * -0x10 + 8);
    pOVar14 = (ON_Plane *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  dVar17 = ON_OBSOLETE_V5_Annotation::Height(&V5_text_object->super_ON_OBSOLETE_V5_Annotation);
  pwVar10 = ON_OBSOLETE_V5_Annotation::TextFormula(&V5_text_object->super_ON_OBSOLETE_V5_Annotation)
  ;
  ON_wString::ON_wString(&local_210,pwVar10);
  bVar1 = ON_wString::IsEmpty(&local_210);
  if (bVar1) {
    pwVar10 = ON_OBSOLETE_V5_Annotation::TextValue(&V5_text_object->super_ON_OBSOLETE_V5_Annotation)
    ;
    ON_wString::operator=(&local_210,pwVar10);
  }
  if (destination == (ON_Text *)0x0) {
    destination = (ON_Text *)operator_new(0x318);
    ON_Text(destination);
  }
  local_200 = 0.0;
  ON_wString::ON_wString(&local_218);
  pwVar10 = ON_wString::operator_cast_to_wchar_t_(&local_210);
  bVar1 = RemoveV5Wrapping(pwVar10,pOVar8,&local_200,&local_218);
  ON_wString::Replace(&local_218,L"\\",L"\\\\");
  if (bVar1) {
    local_208 = ON_DimStyle::DimScale(pOVar8);
    local_1c0 = ON_DimStyle::TextHeight(pOVar8);
    local_1c8 = local_200;
    pwVar10 = ON_wString::operator_cast_to_wchar_t_(&local_218);
    pOVar9 = &local_b0;
    pOVar14 = &local_1b0;
    pOVar15 = pOVar9;
    for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pOVar15->origin).x = (pOVar14->origin).x;
      pOVar14 = (ON_Plane *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
      pOVar15 = (ON_Plane *)((long)pOVar15 + (ulong)bVar16 * -0x10 + 8);
    }
    Create(destination,pwVar10,pOVar8,pOVar9,true,
           ((local_208 * dVar17) / local_1c0) * (dVar17 * 0.1 + local_1c8),0.0);
  }
  else {
    pwVar10 = ON_wString::operator_cast_to_wchar_t_(&local_218);
    pOVar9 = &local_130;
    pOVar14 = &local_1b0;
    pOVar15 = pOVar9;
    for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pOVar15->origin).x = (pOVar14->origin).x;
      pOVar14 = (ON_Plane *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
      pOVar15 = (ON_Plane *)((long)pOVar15 + (ulong)bVar16 * -0x10 + 8);
    }
    Create(destination,pwVar10,pOVar8,pOVar9);
  }
  ON_Plane::~ON_Plane(pOVar9);
  if (0.0 < dVar17) {
    dVar18 = ON_DimStyle::TextHeight(pOVar8);
    if ((dVar17 != dVar18) || (NAN(dVar17) || NAN(dVar18))) {
      ON_Annotation::SetTextHeight(&destination->super_ON_Annotation,pOVar8,dVar17);
    }
  }
  TVar2 = ON_DimStyle::TextHorizontalAlignment(pOVar8);
  if (value_00 != TVar2) {
    ON_Annotation::SetTextHorizontalAlignment(&destination->super_ON_Annotation,pOVar8,value_00);
  }
  TVar3 = ON_DimStyle::TextVerticalAlignment(pOVar8);
  if (value != TVar3) {
    ON_Annotation::SetTextVerticalAlignment(&destination->super_ON_Annotation,pOVar8,value);
  }
  pOVar11 = ON_DimStyle::TextMask(pOVar8);
  local_1f8.m_content_hash.m_digest._12_8_ =
       *(undefined8 *)((pOVar11->m_content_hash).m_digest + 0xc);
  local_1f8.m_bDrawMask = pOVar11->m_bDrawMask;
  local_1f8.m_mask_type = pOVar11->m_mask_type;
  local_1f8.m_mask_frame = pOVar11->m_mask_frame;
  local_1f8.m_reserved2 = pOVar11->m_reserved2;
  local_1f8.m_mask_color.field_0 = (pOVar11->m_mask_color).field_0;
  local_1f8.m_mask_border = pOVar11->m_mask_border;
  local_1f8.m_reserved3 = pOVar11->m_reserved3;
  local_1f8.m_content_hash.m_digest[0] = (pOVar11->m_content_hash).m_digest[0];
  local_1f8.m_content_hash.m_digest[1] = (pOVar11->m_content_hash).m_digest[1];
  local_1f8.m_content_hash.m_digest[2] = (pOVar11->m_content_hash).m_digest[2];
  local_1f8.m_content_hash.m_digest[3] = (pOVar11->m_content_hash).m_digest[3];
  local_1f8.m_content_hash.m_digest._4_8_ = *(undefined8 *)((pOVar11->m_content_hash).m_digest + 4);
  bDraw = ON_OBSOLETE_V5_TextObject::DrawTextMask(V5_text_object);
  bVar1 = ON_TextMask::DrawTextMask(&local_1f8);
  bVar1 = bVar1 != bDraw;
  if (bVar1) {
    ON_TextMask::SetDrawTextMask(&local_1f8,bDraw);
  }
  if (bDraw) {
    local_208 = ON_OBSOLETE_V5_TextObject::MaskOffsetFactor(V5_text_object);
    dVar18 = ON_TextMask::MaskBorder(&local_1f8);
    dVar17 = dVar17 * local_208;
    if ((dVar17 != dVar18) || (NAN(dVar17) || NAN(dVar18))) {
      bVar1 = true;
      ON_TextMask::SetMaskBorder(&local_1f8,dVar17);
    }
    MVar4 = ON_TextMask::MaskFillType(&local_1f8);
    iVar6 = ON_OBSOLETE_V5_TextObject::MaskColorSource(V5_text_object);
    if ((MVar4 == BackgroundColor && iVar6 != 0) || (iVar6 != 1 && MVar4 == MaskColor)) {
      bVar1 = true;
      ON_TextMask::SetMaskFillType(&local_1f8,iVar6 != 0);
    }
    local_1b4 = (anon_union_4_2_6147a14e_for_ON_Color_15)
                ON_OBSOLETE_V5_TextObject::MaskColor(V5_text_object);
    uVar5 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_1b4);
    local_1b8 = (anon_union_4_2_6147a14e_for_ON_Color_15)ON_TextMask::MaskColor(&local_1f8);
    uVar7 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_1b8);
    if (uVar5 == uVar7) goto LAB_004b4b7b;
    color = ON_OBSOLETE_V5_TextObject::MaskColor(V5_text_object);
    ON_TextMask::SetMaskColor(&local_1f8,color);
LAB_004b4b96:
    ON_Annotation::SetTextMask(&destination->super_ON_Annotation,pOVar8,&local_1f8);
  }
  else {
LAB_004b4b7b:
    if (bVar1) goto LAB_004b4b96;
  }
  if (((V5_text_object->super_ON_OBSOLETE_V5_Annotation).m_annotative_scale == true) &&
     (bVar1 = ON_3dmAnnotationContext::AnnotationSettingsAreSet(annotation_context), bVar1)) {
    pOVar12 = ON_3dmAnnotationContext::AnnotationSettings(annotation_context);
    bVar1 = ON_3dmAnnotationSettings::Is_V5_AnnotationScalingEnabled(pOVar12);
    if (bVar1) {
      pOVar12 = ON_3dmAnnotationContext::AnnotationSettings(annotation_context);
      dVar17 = ON_3dmAnnotationSettings::WorldViewTextScale(pOVar12);
      dVar18 = ON_DimStyle::DimScale(pOVar8);
      if ((dVar17 == dVar18) && (!NAN(dVar17) && !NAN(dVar18))) goto LAB_004b4c3f;
      pOVar12 = ON_3dmAnnotationContext::AnnotationSettings(annotation_context);
      dVar18 = ON_3dmAnnotationSettings::WorldViewTextScale(pOVar12);
    }
    else {
      dVar17 = ON_DimStyle::DimScale(pOVar8);
      dVar18 = 1.0;
      if ((dVar17 == 1.0) && (!NAN(dVar17))) goto LAB_004b4c3f;
    }
    ON_Annotation::SetDimScale(&destination->super_ON_Annotation,pOVar8,dVar18);
  }
LAB_004b4c3f:
  Internal_SetObsoleteV5TextObjectInformation(destination,annotation_context,V5_text_object);
  pOVar8 = ON_3dmAnnotationContext::ParentDimStyle(annotation_context);
  ON_DimStyle::ContentHash(pOVar8);
  pOVar8 = ON_Annotation::DimensionStyle(&destination->super_ON_Annotation,pOVar8);
  ON_DimStyle::ContentHash(pOVar8);
  ON_wString::~ON_wString(&local_218);
  ON_wString::~ON_wString(&local_210);
  ON_Plane::~ON_Plane(&local_1b0);
  return (ON_Text *)&destination->super_ON_Annotation;
}

Assistant:

ON_Text* ON_Text::CreateFromV5TextObject(
  const class ON_OBSOLETE_V5_TextObject& V5_text_object,
  const class ON_3dmAnnotationContext* annotation_context,
  ON_Text* destination
)
{
  if (nullptr == annotation_context)
    annotation_context = &ON_3dmAnnotationContext::Default;

  const ON_DimStyle& dim_style = annotation_context->DimStyle();

  const unsigned int just = V5_text_object.Justification();
  const ON::TextHorizontalAlignment halign = ON::TextHorizontalAlignmentFromV5Justification(just);
  const ON::TextVerticalAlignment valign = ON::TextVerticalAlignmentFromV5Justification(just);

  ON_Plane plane = V5_text_object.Plane();
  const double v5height = V5_text_object.Height();
  ON_wString txt = V5_text_object.TextFormula();
  if (txt.IsEmpty())
    txt = V5_text_object.TextValue();

  ON_Text* V6_text_object = (nullptr != destination)
    ? destination
    : new ON_Text();

  double wrapwidth = 0.0;
  ON_wString newtxt;
  bool wraptext = RemoveV5Wrapping(txt, dim_style, wrapwidth, newtxt);

  newtxt.Replace(L"\\", L"\\\\");

  if (wraptext)
  {
    double dimscale = dim_style.DimScale();
    double dsht = dim_style.TextHeight();
    double widthscale = v5height * dimscale / dsht;
    double width = (wrapwidth + (v5height * 0.1)) * widthscale;
    V6_text_object->Create(newtxt, &dim_style, plane, true, width, 0.0);
  }
  else
    V6_text_object->Create(newtxt, &dim_style, plane);

    // These override settings currently get erased by 
  // ON_Annotation::SetDimensionStyleId(ON_UUID dimstyle_id)
  // which deletes any existing override style

  if (v5height > 0.0 && v5height != dim_style.TextHeight())
    V6_text_object->SetTextHeight(&dim_style, v5height);
  if (halign != dim_style.TextHorizontalAlignment())
    V6_text_object->SetTextHorizontalAlignment(&dim_style, halign);
  if (valign != dim_style.TextVerticalAlignment())
    V6_text_object->SetTextVerticalAlignment(&dim_style, valign);

  bool setmask = false;
  ON_TextMask mask = dim_style.TextMask();
  bool drawmask = V5_text_object.DrawTextMask();
  if (drawmask != mask.DrawTextMask())
  {
    mask.SetDrawTextMask(drawmask);
    setmask = true;
  }
  if (drawmask)
  {
    double mb = V5_text_object.MaskOffsetFactor() * v5height;
    if (mb != mask.MaskBorder())
    {
      mask.SetMaskBorder(mb);
      setmask = true;
    }
    ON_TextMask::MaskType mt = mask.MaskFillType();
    int mc = V5_text_object.MaskColorSource();
    if ((mt == ON_TextMask::MaskType::BackgroundColor && mc != 0) ||
      (mt == ON_TextMask::MaskType::MaskColor && mc != 1))
    {
      mask.SetMaskFillType(mc == 0 ? ON_TextMask::MaskType::BackgroundColor : ON_TextMask::MaskType::MaskColor);
      setmask = true;
    }
    if (V5_text_object.MaskColor() != mask.MaskColor())
    {
      mask.SetMaskColor(V5_text_object.MaskColor());
      setmask = true;
    }
  }
  if (setmask)
    V6_text_object->SetTextMask(&dim_style, mask);


  if (V5_text_object.m_annotative_scale && annotation_context->AnnotationSettingsAreSet())
  {
    if (false == annotation_context->AnnotationSettings().Is_V5_AnnotationScalingEnabled())
    {
      if (!(1.0 == dim_style.DimScale()))
      {
        V6_text_object->SetDimScale(&dim_style, 1.0);
      }
    }
    else
    {
      if (!(annotation_context->AnnotationSettings().WorldViewTextScale() == dim_style.DimScale()))
      {
        V6_text_object->SetDimScale(&dim_style, annotation_context->AnnotationSettings().WorldViewTextScale());
      }
    }
  }
  V6_text_object->Internal_SetObsoleteV5TextObjectInformation(
    annotation_context,
    V5_text_object
  );

  // updates any m_overrides to be current and updates content hash.
  const ON_DimStyle& parent_dim_style = annotation_context->ParentDimStyle();
  parent_dim_style.ContentHash();
  V6_text_object->DimensionStyle(parent_dim_style).ContentHash();

  return V6_text_object;
}